

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O1

JavascriptString * Js::JavascriptNumber::ToLocaleString(double value,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  charcount_t cVar4;
  BOOL BVar5;
  Var aValue;
  JavascriptString *pJVar6;
  undefined4 extraout_var;
  size_t pre_allocated_buffer_size;
  HeapAllocator *this;
  undefined4 *puVar7;
  WCHAR *buffer;
  size_t byteSize;
  WCHAR *buffer_00;
  WCHAR local_a68 [4];
  WCHAR szRes [1280];
  TrackAllocData data;
  
  bVar2 = NumberUtilities::IsFinite(value);
  if (!bVar2) {
    pJVar6 = ToLocaleStringNanOrInfinite(value,scriptContext);
    return pJVar6;
  }
  aValue = FormatDoubleToString(value,FormatFixed,-1,scriptContext);
  pJVar6 = VarTo<Js::JavascriptString>(aValue);
  iVar3 = (*(pJVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar6);
  cVar4 = JavascriptString::GetLength(pJVar6);
  buffer_00 = local_a68;
  pre_allocated_buffer_size =
       PlatformAgnostic::Numbers::Utility::NumberToDefaultLocaleString
                 ((WCHAR *)CONCAT44(extraout_var,iVar3),(ulong)cVar4,buffer_00,0x500);
  if (pre_allocated_buffer_size != 0) {
    if (pre_allocated_buffer_size < 0x501) {
      buffer = (char16_t *)0x0;
    }
    else {
      szRes._2552_8_ = &char16_t::typeinfo;
      this = Memory::HeapAllocator::TrackAllocInfo
                       (&Memory::HeapAllocator::Instance,(TrackAllocData *)(szRes + 0x4fc));
      byteSize = 0xffffffffffffffff;
      if (-1 < (long)pre_allocated_buffer_size) {
        byteSize = pre_allocated_buffer_size * 2;
      }
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_00cec147;
        *puVar7 = 0;
      }
      buffer = (WCHAR *)Memory::HeapAllocator::AllocT<false>(this,byteSize);
      if (buffer == (WCHAR *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) goto LAB_00cec147;
        *puVar7 = 0;
      }
      pre_allocated_buffer_size =
           PlatformAgnostic::Numbers::Utility::NumberToDefaultLocaleString
                     ((WCHAR *)CONCAT44(extraout_var,iVar3),(ulong)cVar4,buffer,
                      pre_allocated_buffer_size);
      buffer_00 = buffer;
      if (pre_allocated_buffer_size == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                    ,0x45e,"(false)","GetNumberFormatEx failed");
        if (bVar2) {
          *puVar7 = 0;
          JavascriptError::ThrowError(scriptContext,-0x7ff5ffcd,(PCWSTR)0x0);
        }
LAB_00cec147:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    pJVar6 = JavascriptString::NewCopySz(buffer_00,scriptContext);
    if (buffer != (char16_t *)0x0) {
      Memory::DeleteArray<Memory::HeapAllocator,char16_t>
                (&Memory::HeapAllocator::Instance,pre_allocated_buffer_size,buffer);
    }
  }
  return pJVar6;
}

Assistant:

JavascriptString* JavascriptNumber::ToLocaleString(double value, ScriptContext* scriptContext)
    {
        WCHAR   szRes[bufSize];
        WCHAR * pszRes = NULL;
        WCHAR * pszToBeFreed = NULL;
        size_t  count;

        if (!Js::NumberUtilities::IsFinite(value))
        {
            //
            // +- Infinity : use the localized string
            // NaN would be returned as NaN
            //
            return ToLocaleStringNanOrInfinite(value, scriptContext);
        }

        JavascriptString *result = nullptr;

        JavascriptString *dblStr = VarTo<JavascriptString>(FormatDoubleToString(value, NumberUtilities::FormatFixed, -1, scriptContext));
        const char16* szValue = dblStr->GetSz();
        const size_t szLength = dblStr->GetLength();

        pszRes = szRes;
        count = Numbers::Utility::NumberToDefaultLocaleString(szValue, szLength, pszRes, bufSize);

        if( count == 0 )
        {
            return dblStr;
        }
        else
        {
            if( count > bufSize )
            {
                pszRes = pszToBeFreed = HeapNewArray(char16, count);

                count = Numbers::Utility::NumberToDefaultLocaleString(szValue, szLength, pszRes, count);

                if ( count == 0 )
                {
                     AssertMsg(false, "GetNumberFormatEx failed");
                     JavascriptError::ThrowError(scriptContext, VBSERR_InternalError);
                }
            }

            if ( count != 0 )
            {
                result = JavascriptString::NewCopySz(pszRes, scriptContext);
            }
        }

        if ( pszToBeFreed )
        {
            HeapDeleteArray(count, pszToBeFreed);
        }

        return result;
    }